

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPParser.cpp
# Opt level: O2

SNMP_ERROR_RESPONSE
handlePacket(uint8_t *buffer,int packetLength,int *responseLength,int max_packet_size,
            deque<ValueCallback_*,_std::allocator<ValueCallback_*>_> *callbacks,string *_community,
            string *_readOnlyCommunity,informCB informCallback,void *ctx)

{
  __type _Var1;
  __type _Var2;
  bool bVar3;
  SNMP_PACKET_PARSE_ERROR SVar4;
  int iVar5;
  SNMP_ERROR_STATUS SVar6;
  VarBind *pVVar7;
  SNMP_ERROR_STATUS SVar8;
  SNMP_ERROR_STATUS SVar9;
  VarBind *item;
  VarBind *response_00;
  _Map_pointer local_240;
  deque<VarBind,_std::allocator<VarBind>_> outResponseList;
  SNMPPacket request;
  SNMPResponse response;
  
  SNMPPacket::SNMPPacket(&request);
  SVar4 = SNMPPacket::parseFrom(&request,buffer,(long)packetLength);
  if (SVar4 < 1) {
    SVar6 = ~BAD_VALUE;
    goto LAB_0010860a;
  }
  if (request.packetPDUType == GetResponsePDU) {
    SVar6 = WRONG_TYPE;
    if (informCallback != (informCB)0x0) {
      (*informCallback)(ctx,request.requestID,request.errorStatus.errorStatus == NO_ERROR);
    }
    goto LAB_0010860a;
  }
  if (_readOnlyCommunity->_M_string_length == 0) {
    _Var1 = false;
  }
  else {
    _Var1 = std::operator==(_readOnlyCommunity,&request.communityString);
  }
  _Var2 = std::operator==(_community,&request.communityString);
  if ((_Var1 | _Var2) != 1) {
    SVar6 = ~NO_SUCH_NAME;
    goto LAB_0010860a;
  }
  SNMPResponse::SNMPResponse(&response,&request);
  std::_Deque_base<VarBind,_std::allocator<VarBind>_>::_Deque_base
            (&outResponseList.super__Deque_base<VarBind,_std::allocator<VarBind>_>);
  SVar8 = GEN_ERR;
  SVar9 = SVar8;
  if (request.packetPDUType - GetRequestPDU < 2) {
    bVar3 = handleGetRequestPDU(callbacks,&request.varbindList,&outResponseList,request.snmpVersion,
                                request.packetPDUType == GetNextRequestPDU);
    if (!bVar3) goto LAB_001085a7;
    SVar6 = request.packetPDUType == GetRequestPDU ^ BAD_VALUE;
LAB_0010853a:
    local_240 = outResponseList.super__Deque_base<VarBind,_std::allocator<VarBind>_>._M_impl.
                super__Deque_impl_data._M_start._M_node;
    pVVar7 = outResponseList.super__Deque_base<VarBind,_std::allocator<VarBind>_>._M_impl.
             super__Deque_impl_data._M_start._M_last;
    response_00 = outResponseList.super__Deque_base<VarBind,_std::allocator<VarBind>_>._M_impl.
                  super__Deque_impl_data._M_start._M_cur;
    while (response_00 !=
           outResponseList.super__Deque_base<VarBind,_std::allocator<VarBind>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur) {
      if (response_00->errorStatus == NO_ERROR) {
        SNMPResponse::addResponse(&response,response_00);
      }
      else {
        SNMPResponse::addErrorResponse(&response,response_00);
      }
      response_00 = response_00 + 1;
      if (response_00 == pVVar7) {
        response_00 = local_240[1];
        local_240 = local_240 + 1;
        pVVar7 = response_00 + 10;
      }
    }
  }
  else {
    if (request.packetPDUType == SetRequestPDU) {
      SVar9 = NO_ACCESS;
      if (_Var2) {
        bVar3 = handleSetRequestPDU(callbacks,&request.varbindList,&outResponseList,
                                    request.snmpVersion);
        SVar6 = GEN_ERR;
        goto LAB_00108533;
      }
    }
    else if ((request.packetPDUType == GetBulkRequestPDU) &&
            (request.snmpVersion == SNMP_VERSION_2C)) {
      bVar3 = handleGetBulkRequestPDU
                        (callbacks,&request.varbindList,&outResponseList,
                         request.errorStatus.errorStatus,request.errorIndex.errorIndex);
      SVar6 = READ_ONLY;
LAB_00108533:
      SVar9 = SVar8;
      if (bVar3 != false) goto LAB_0010853a;
    }
LAB_001085a7:
    SNMPResponse::setGlobalError(&response,SVar9,0,1);
    SVar6 = NO_ACCESS;
  }
  memset(buffer,0,(long)max_packet_size);
  iVar5 = SNMPPacket::serialiseInto(&response.super_SNMPPacket,buffer,(long)max_packet_size);
  *responseLength = iVar5;
  if (iVar5 < 1) {
    SVar6 = ~TOO_BIG;
  }
  std::deque<VarBind,_std::allocator<VarBind>_>::~deque(&outResponseList);
  SNMPPacket::~SNMPPacket(&response.super_SNMPPacket);
LAB_0010860a:
  SNMPPacket::~SNMPPacket(&request);
  return SVar6;
}

Assistant:

SNMP_ERROR_RESPONSE handlePacket(uint8_t* buffer, int packetLength, int* responseLength, int max_packet_size, std::deque<ValueCallback*> &callbacks, const std::string& _community, const std::string& _readOnlyCommunity, informCB informCallback, void* ctx){
    SNMPPacket request;

    SNMP_PACKET_PARSE_ERROR parseResult = request.parseFrom(buffer, packetLength);
    if(parseResult <= 0){
        SNMP_LOGW("Received Error code: %d when attempting to parse\n", parseResult);
        return SNMP_REQUEST_INVALID;
    }

    SNMP_LOGD("Valid SNMP Packet!");

    if(request.packetPDUType == GetResponsePDU){
        SNMP_LOGD("Received GetResponse! probably as a result of a recent InformTrap: %lu", request.requestID);
        if(informCallback){
            informCallback(ctx, request.requestID, !request.errorStatus.errorStatus);
        } else {
            SNMP_LOGW("Not sure what to do with Inform\n");
        }
        return SNMP_INFORM_RESPONSE_OCCURRED;
    }

    SNMP_PERMISSION requestPermission = getPermissionOfRequest(request, _community, _readOnlyCommunity);
    if(requestPermission == SNMP_PERM_NONE){
        SNMP_LOGW("Invalid communitystring provided: %s, no response to give\n", request.communityString.c_str());
        return SNMP_REQUEST_INVALID_COMMUNITY;
    }
    
    // this will take the required stuff from request - like requestID and community string etc
    SNMPResponse response = SNMPResponse(request);

    std::deque<VarBind> outResponseList;

    bool pass = false;
    SNMP_ERROR_RESPONSE handleStatus = SNMP_NO_ERROR;
    SNMP_ERROR_STATUS globalError = GEN_ERR;

    switch(request.packetPDUType){
        case GetRequestPDU:
        case GetNextRequestPDU:
            pass = handleGetRequestPDU(callbacks, request.varbindList, outResponseList, request.snmpVersion, request.packetPDUType == GetNextRequestPDU);
            handleStatus = request.packetPDUType == GetRequestPDU ? SNMP_GET_OCCURRED : SNMP_GETNEXT_OCCURRED;
        break;
        case GetBulkRequestPDU:
            if(request.snmpVersion != SNMP_VERSION_2C){
                SNMP_LOGD("Received GetBulkRequest in SNMP_VERSION_1");
                pass = false;
                globalError = GEN_ERR;
            } else {
                pass = handleGetBulkRequestPDU(callbacks, request.varbindList, outResponseList, request.errorStatus.nonRepeaters, request.errorIndex.maxRepititions);
                handleStatus = SNMP_GETBULK_OCCURRED;
            }
        break;
        case SetRequestPDU:
            if(requestPermission != SNMP_PERM_READ_WRITE){
                SNMP_LOGD("Attempting to perform a SET without required permissions");
                pass = false;
                globalError = NO_ACCESS;
            } else {
                pass = handleSetRequestPDU(callbacks, request.varbindList, outResponseList, request.snmpVersion);
                handleStatus = SNMP_SET_OCCURRED;
            }
        break;
        default:
            SNMP_LOGD("Not sure what to do with SNMP PDU of type: %d\n", request.packetPDUType);
            handleStatus = SNMP_UNKNOWN_PDU_OCCURRED;
            pass = false;
        break;
    }

    if(pass){
        for(const auto& item : outResponseList){
            if(item.errorStatus != NO_ERROR){
                response.addErrorResponse(item);
            } else {
                response.addResponse(item);
            }
        }
    } else {
        // Something went wrong, generic error response
        SNMP_LOGD("Handled error when building request, error: %d, sending error PDU", globalError);
        response.setGlobalError(globalError, 0, true);
        handleStatus = SNMP_ERROR_PACKET_SENT;
    }

    memset(buffer, 0, max_packet_size);

    *responseLength = response.serialiseInto(buffer, max_packet_size);
    if(*responseLength <= 0){
        SNMP_LOGD("Failed to build response packet");
        return SNMP_FAILED_SERIALISATION;
    }

    return handleStatus;
}